

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoding-conversion.cc
# Opt level: O0

size_t __thiscall
EncodingConversion::decode
          (EncodingConversion *this,u16string *string,char *input_start,size_t input_length,
          bool is_last_chunk)

{
  bool bVar1;
  byte bVar2;
  int iVar3;
  reference pvVar4;
  size_type sVar5;
  ulong uVar6;
  float local_9c;
  size_t new_size_1;
  size_t old_size;
  int conversion_result;
  bool incomplete_sequence_at_chunk_end;
  char *output_end;
  char *output_pointer;
  char *output_start;
  char *input_end;
  char *input_pointer;
  size_t new_size;
  size_t previous_size;
  size_t sStack_28;
  bool is_last_chunk_local;
  size_t input_length_local;
  char *input_start_local;
  u16string *string_local;
  EncodingConversion *this_local;
  
  previous_size._7_1_ = is_last_chunk;
  sStack_28 = input_length;
  input_length_local = (size_t)input_start;
  input_start_local = (char *)string;
  string_local = (u16string *)this;
  new_size = std::__cxx11::
             basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                       (string);
  std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
  resize((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
         input_start_local,new_size + sStack_28);
  input_pointer = (char *)new_size;
  input_end = (char *)input_length_local;
  output_start = (char *)(input_length_local + sStack_28);
  output_pointer =
       (char *)std::__cxx11::
               basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
               operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)input_start_local,0);
  output_end = (char *)((long)output_pointer + new_size * 2);
  _conversion_result = (reference)((long)output_end + sStack_28 * 2);
  bVar2 = 0;
  do {
    bVar1 = false;
    if (input_end < output_start) {
      bVar1 = (bool)(bVar2 ^ 1);
    }
    if (!bVar1) {
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      resize((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             input_start_local,(size_type)input_pointer);
      return (long)input_end - input_length_local;
    }
    iVar3 = convert(this,&input_end,output_start,&output_end,(char *)_conversion_result);
    input_pointer = (char *)(((long)output_end - (long)output_pointer) / 2);
    switch(iVar3) {
    case 0:
      break;
    case 1:
      sVar5 = std::__cxx11::
              basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::size
                        ((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                          *)input_start_local);
      local_9c = (float)sVar5;
      uVar6 = (ulong)(local_9c + local_9c);
      uVar6 = uVar6 | (long)((local_9c + local_9c) - 9.223372e+18) & (long)uVar6 >> 0x3f;
      std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
      resize((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_> *)
             input_start_local,uVar6);
      output_pointer =
           (char *)std::__cxx11::
                   basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
                   operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                               *)input_start_local,0);
      output_end = (char *)((long)output_pointer + sVar5);
      _conversion_result = (reference)((long)output_pointer + uVar6);
      break;
    case 3:
      if ((previous_size._7_1_ & 1) == 0) {
        bVar2 = 1;
        break;
      }
    case 2:
      input_end = input_end + 1;
      pvVar4 = std::__cxx11::
               basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>::
               operator[]((basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>
                           *)input_start_local,(size_type)input_pointer);
      *pvVar4 = L'�';
      output_end = output_end + 2;
      input_pointer = input_pointer + 1;
    }
  } while( true );
}

Assistant:

size_t EncodingConversion::decode(u16string &string, const char *input_start,
                                  size_t input_length, bool is_last_chunk) {
  size_t previous_size = string.size();
  string.resize(previous_size + input_length);

  size_t new_size = previous_size;
  const char *input_pointer = input_start;
  const char *input_end = input_start + input_length;
  char *output_start = reinterpret_cast<char *>(&string[0]);
  char *output_pointer = output_start + previous_size * bytes_per_character;
  char *output_end = output_pointer + input_length * bytes_per_character;
  bool incomplete_sequence_at_chunk_end = false;

  while (input_pointer < input_end && !incomplete_sequence_at_chunk_end) {
    int conversion_result = convert(
      &input_pointer,
      input_end,
      &output_pointer,
      output_end
    );

    new_size = (output_pointer - output_start) / bytes_per_character;

    switch (conversion_result) {
      case Ok: break;

      // Encountered an incomplete multibyte sequence at end of the chunk. If
      // this is not the last chunk, then stop here, because maybe the
      // remainder of the character will occur at the beginning of the next
      // chunk. If this *is* the last chunk, then we must consume these bytes,
      // so we fall through to the next case and append the unicode
      // replacement character.
      case InvalidTrailing:
        if (!is_last_chunk) {
          incomplete_sequence_at_chunk_end = true;
          break;
        }

      // Encountered an invalid multibyte sequence. Append the unicode
      // replacement character and resume transcoding.
      case Invalid:
        input_pointer++;
        string[new_size] = replacement_character;
        output_pointer += bytes_per_character;
        new_size++;
        break;

      // Insufficient room in the output buffer to write all characters in the
      // input buffer. Grow the content vector and resume transcoding.
      case Partial:
        size_t old_size = string.size();
        size_t new_size = old_size * buffer_growth_factor;
        string.resize(new_size);
        output_start = reinterpret_cast<char *>(&string[0]);
        output_pointer = output_start + old_size;
        output_end = output_start + new_size;
        break;
    }
  }

  string.resize(new_size);
  return input_pointer - input_start;
}